

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::filter_dx_dy(Surf *this,int x,int y,int fs,float *dx,float *dy)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ImageBase *this_00;
  TypedImageBase<long> *this_01;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  float fVar14;
  float norm;
  SatType y4;
  SatType y3;
  SatType y2;
  SatType y1;
  SatType x8;
  SatType x7;
  SatType x6;
  SatType x5;
  SatType x4;
  SatType x3;
  SatType x2;
  SatType x1;
  SatType *iter;
  SatType *ptr;
  int width;
  float *dy_local;
  float *dx_local;
  int fs_local;
  int y_local;
  int x_local;
  Surf *this_local;
  
  this_00 = (ImageBase *)
            std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  iVar9 = core::ImageBase::width(this_00);
  this_01 = &std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->sat)->super_TypedImageBase<long>;
  plVar10 = core::TypedImageBase<long>::begin(this_01);
  plVar11 = plVar10 + (long)((x - fs) + -1) + (long)(((y - fs) + -1) * iVar9);
  lVar1 = *plVar11;
  plVar11 = plVar11 + fs;
  plVar12 = plVar11 + 1;
  plVar13 = plVar12 + fs;
  lVar2 = *plVar13;
  plVar13 = plVar13 + (iVar9 + -1) * (fs * 2 + 1);
  lVar3 = *plVar13;
  plVar13 = plVar13 + fs;
  lVar4 = (plVar13 + 1)[fs];
  plVar10 = plVar10 + (long)((x - fs) + -1) + (long)((y + -1) * iVar9);
  lVar5 = *plVar10;
  plVar10 = plVar10 + (fs * 2 + 1);
  lVar6 = *plVar10;
  lVar7 = plVar10[iVar9 + fs * -2 + -1];
  lVar8 = (plVar10 + (iVar9 + fs * -2 + -1))[fs * 2 + 1];
  fVar14 = (float)((fs * 2 + 1) * fs * (fs + 1));
  *dx = (float)((((lVar4 + *plVar11) - lVar2) - *plVar13) -
               (((plVar13[1] + lVar1) - *plVar12) - lVar3)) / fVar14;
  *dy = (float)((((lVar4 + lVar5) - lVar3) - lVar6) - (((lVar8 + lVar1) - lVar7) - lVar2)) / fVar14;
  return;
}

Assistant:

void
Surf::filter_dx_dy (int x, int y, int fs, float* dx, float* dy)
{
    int const width = this->sat->width();
    SatType const* ptr = this->sat->begin();

    /*
     * To have a center pixel, filter size needs to be odd.
     * To ensure symmetry in the filters, we include the center row in
     * both sides of the dy filter, and the center column in both sides
     * of the dx filter, which cancels them out. However, this costs
     * four additional lookups (12 instead of 8).
     */
    SatType const* iter = ptr + (x - fs - 1) + (y - fs - 1) * width;
    SatType x1 = *iter; iter += fs;
    SatType x2 = *iter; iter += 1;
    SatType x3 = *iter; iter += fs;
    SatType x4 = *iter; iter += (width - 1) * (2 * fs + 1);

    SatType x5 = *iter; iter += fs;
    SatType x6 = *iter; iter += 1;
    SatType x7 = *iter; iter += fs;
    SatType x8 = *iter;

    iter = ptr + (x - fs - 1) + (y - 1) * width;
    SatType y1 = *iter; iter += 2 * fs + 1;
    SatType y2 = *iter; iter += width - 2 * fs - 1;
    SatType y3 = *iter; iter += 2 * fs + 1;
    SatType y4 = *iter;

    /*
     * Normalize filter by size "(2 * fs + 1) * fs" and normalize discrete
     * derivative with distance between the Wavelet box centers "fs + 1".
     */
    float norm = static_cast<float>((2 * fs + 1) * fs * (fs + 1));
    *dx = static_cast<float>((x8 + x2 - x4 - x6) - (x7 + x1 - x3 - x5)) / norm;
    *dy = static_cast<float>((x8 + y1 - x5 - y2) - (y4 + x1 - y3 - x4)) / norm;
}